

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

char * BaseFileSearch(char *file,char *ext,bool lookfirstinprogdir)

{
  bool bVar1;
  int iVar2;
  FString *this;
  BYTE *pBVar3;
  char *pcVar4;
  char *key;
  FString dir;
  char *value;
  FString local_58;
  FString local_50;
  char *local_48;
  char *local_40;
  FString local_38;
  
  this = &local_58;
  if ((file != (char *)0x0) && (*file != '\0')) {
    if (lookfirstinprogdir) {
      pBVar3 = "/";
      if (progdir.Chars[(ulong)*(uint *)(progdir.Chars + -0xc) - 1] == '/') {
        pBVar3 = "";
      }
      mysnprintf(BaseFileSearch::wad,0x1000,"%s%s%s",progdir.Chars,pBVar3,file);
      bVar1 = DirEntryExists(BaseFileSearch::wad);
      if (bVar1) {
        return BaseFileSearch::wad;
      }
    }
    bVar1 = DirEntryExists(file);
    if (bVar1) {
      mysnprintf(BaseFileSearch::wad,0x1000,"%s",file);
      return BaseFileSearch::wad;
    }
    if (((GameConfig != (FGameConfigFile *)0x0) &&
        (bVar1 = FConfigFile::SetSection
                           (&GameConfig->super_FConfigFile,"FileSearch.Directories",false), bVar1))
       && (bVar1 = FConfigFile::NextInSection
                             (&GameConfig->super_FConfigFile,&local_58.Chars,&local_48), bVar1)) {
      local_40 = FString::NullString.Nothing;
      pcVar4 = BaseFileSearch::wad;
      do {
        iVar2 = strcasecmp(local_58.Chars,"Path");
        if (iVar2 == 0) {
          local_50.Chars = local_40;
          FString::NullString.RefCount = FString::NullString.RefCount + 1;
          NicePath((char *)&local_38);
          FString::operator=(&local_50,&local_38);
          FString::~FString(&local_38);
          if ((ulong)((FNullStringData *)(local_50.Chars + -0xc))->Len != 0) {
            pBVar3 = "";
            if (local_50.Chars[(ulong)((FNullStringData *)(local_50.Chars + -0xc))->Len - 1] != '/')
            {
              pBVar3 = "/";
            }
            mysnprintf(BaseFileSearch::wad,0x1000,"%s%s%s",local_50.Chars,pBVar3,file);
            bVar1 = DirEntryExists(BaseFileSearch::wad);
            if (bVar1) {
              this = &local_50;
              goto LAB_004ba438;
            }
          }
          FString::~FString(&local_50);
        }
        bVar1 = FConfigFile::NextInSection(&GameConfig->super_FConfigFile,&local_58.Chars,&local_48)
        ;
      } while (bVar1);
    }
    if (ext != (char *)0x0) {
      FString::FString(&local_58,file);
      DefaultExtension(&local_58,ext);
      pcVar4 = BaseFileSearch(local_58.Chars,(char *)0x0,false);
LAB_004ba438:
      FString::~FString(this);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *BaseFileSearch (const char *file, const char *ext, bool lookfirstinprogdir)
{
	static char wad[PATH_MAX];

	if (file == NULL || *file == '\0')
	{
		return NULL;
	}
	if (lookfirstinprogdir)
	{
		mysnprintf (wad, countof(wad), "%s%s%s", progdir.GetChars(), progdir[progdir.Len() - 1] != '/' ? "/" : "", file);
		if (DirEntryExists (wad))
		{
			return wad;
		}
	}

	if (DirEntryExists (file))
	{
		mysnprintf (wad, countof(wad), "%s", file);
		return wad;
	}

	if (GameConfig != NULL && GameConfig->SetSection ("FileSearch.Directories"))
	{
		const char *key;
		const char *value;

		while (GameConfig->NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0)
			{
				FString dir;

				dir = NicePath(value);
				if (dir.IsNotEmpty())
				{
					mysnprintf (wad, countof(wad), "%s%s%s", dir.GetChars(), dir[dir.Len() - 1] != '/' ? "/" : "", file);
					if (DirEntryExists (wad))
					{
						return wad;
					}
				}
			}
		}
	}

	// Retry, this time with a default extension
	if (ext != NULL)
	{
		FString tmp = file;
		DefaultExtension (tmp, ext);
		return BaseFileSearch (tmp, NULL);
	}
	return NULL;
}